

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O0

word Hop_ManComputeTruth6_rec(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  ulong local_50;
  ulong local_48;
  word Truth1;
  word Truth0;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_ObjIsPi(pObj);
  if (iVar1 == 0) {
    iVar1 = Hop_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Hop_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopTruth.c"
                    ,0xf9,"word Hop_ManComputeTruth6_rec(Hop_Man_t *, Hop_Obj_t *)");
    }
    pHVar2 = Hop_ObjFanin0(pObj);
    local_48 = Hop_ManComputeTruth6_rec(p,pHVar2);
    pHVar2 = Hop_ObjFanin1(pObj);
    local_50 = Hop_ManComputeTruth6_rec(p,pHVar2);
    iVar1 = Hop_ObjFaninC0(pObj);
    if (iVar1 != 0) {
      local_48 = local_48 ^ 0xffffffffffffffff;
    }
    iVar1 = Hop_ObjFaninC1(pObj);
    if (iVar1 != 0) {
      local_50 = local_50 ^ 0xffffffffffffffff;
    }
    p_local = (Hop_Man_t *)(local_48 & local_50);
  }
  else {
    p_local = (Hop_Man_t *)Truth[(pObj->field_0).iData];
  }
  return (word)p_local;
}

Assistant:

word Hop_ManComputeTruth6_rec( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    word Truth0, Truth1;
    if ( Hop_ObjIsPi(pObj) )
        return Truth[pObj->iData];
    assert( Hop_ObjIsNode(pObj) );
    Truth0 = Hop_ManComputeTruth6_rec( p, Hop_ObjFanin0(pObj) );
    Truth1 = Hop_ManComputeTruth6_rec( p, Hop_ObjFanin1(pObj) );
    Truth0 = Hop_ObjFaninC0(pObj) ? ~Truth0 : Truth0;
    Truth1 = Hop_ObjFaninC1(pObj) ? ~Truth1 : Truth1;
    return Truth0 & Truth1;
}